

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O2

void dill_virtual_lea(dill_stream c,int dest,int src)

{
  int iVar1;
  char *__s;
  
  if (src < 100) {
    __s = "error, attempt to do dill_virtual_lea on non-virtual";
  }
  else {
    iVar1 = dill_type_of(c,src);
    if (iVar1 == 0xc) {
      (*c->j->lea)(c,0,0,dest,src,0);
      return;
    }
    __s = "error, attempt to do dill_virtual_lea on variable of type other than V_B";
  }
  puts(__s);
  return;
}

Assistant:

extern void
dill_virtual_lea(dill_stream c, int dest, int src)
{
    if (src < 100) {
        printf("error, attempt to do dill_virtual_lea on non-virtual\n");
        return;
    }
    if (dill_type_of(c, src) != DILL_B) {
        printf(
            "error, attempt to do dill_virtual_lea on variable of type other "
            "than V_B\n");
        return;
    }
    dill_lea(c, dest, src, 0);
}